

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

Publication * __thiscall helics::ValueFederate::getPublication(ValueFederate *this,string_view name)

{
  string_view addition;
  string_view key;
  string_view key_00;
  bool bVar1;
  Publication *pPVar2;
  pointer this_00;
  size_t in_RDX;
  ValueFederateManager *in_RSI;
  Publication *pub;
  char *in_stack_ffffffffffffff98;
  char *in_stack_fffffffffffffff8;
  
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                *)0x293245);
  key._M_str = in_stack_fffffffffffffff8;
  key._M_len = in_RDX;
  pPVar2 = ValueFederateManager::getPublication(in_RSI,key);
  bVar1 = Interface::isValid((Interface *)0x293286);
  if (!bVar1) {
    this_00 = std::
              unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
              ::operator->((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                            *)0x29329c);
    addition._M_str = in_stack_ffffffffffffff98;
    addition._M_len = in_RDX;
    Federate::localNameGenerator_abi_cxx11_((Federate *)in_RSI,addition);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    key_00._M_str = in_stack_fffffffffffffff8;
    key_00._M_len = in_RDX;
    pPVar2 = ValueFederateManager::getPublication(in_RSI,key_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return pPVar2;
}

Assistant:

const Publication& ValueFederate::getPublication(std::string_view name) const
{
    auto& pub = vfManager->getPublication(name);
    if (!pub.isValid()) {
        return vfManager->getPublication(localNameGenerator(name));
    }
    return pub;
}